

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

int zip_entry_openbyindex(zip_t *zip,int index)

{
  mz_bool mVar1;
  long lVar2;
  char *pcVar3;
  char *pFilename;
  mz_uint8 *pHeader;
  undefined1 local_270 [4];
  mz_uint namelen;
  mz_zip_archive_file_stat stats;
  mz_zip_archive *pZip;
  int index_local;
  zip_t *zip_local;
  
  if (zip == (zip_t *)0x0) {
    zip_local._4_4_ = -1;
  }
  else if ((zip->archive).m_zip_mode == MZ_ZIP_MODE_READING) {
    if ((index < 0) || ((zip->archive).m_total_files <= (uint)index)) {
      zip_local._4_4_ = -1;
    }
    else {
      lVar2 = (long)(((zip->archive).m_pState)->m_central_dir).m_p +
              (ulong)*(uint *)((long)(((zip->archive).m_pState)->m_central_dir_offsets).m_p +
                              (long)index * 4);
      if (lVar2 == 0) {
        zip_local._4_4_ = -1;
      }
      else {
        stats.m_comment._248_8_ = zip;
        pcVar3 = strrpl((char *)(lVar2 + 0x2e),(ulong)*(ushort *)(lVar2 + 0x1c),'\\','/');
        (zip->entry).name = pcVar3;
        if ((zip->entry).name == (char *)0x0) {
          zip_local._4_4_ = -1;
        }
        else {
          mVar1 = mz_zip_reader_file_stat
                            ((mz_zip_archive *)stats.m_comment._248_8_,index,
                             (mz_zip_archive_file_stat *)local_270);
          if (mVar1 == 0) {
            zip_local._4_4_ = -1;
          }
          else {
            (zip->entry).index = index;
            (zip->entry).comp_size = stats._24_8_;
            (zip->entry).uncomp_size = stats.m_comp_size;
            (zip->entry).uncomp_crc32 = (mz_uint32)stats.m_time;
            (zip->entry).offset = (ulong)namelen;
            (zip->entry).header_offset = stats._48_8_;
            (zip->entry).method = stats.m_central_dir_ofs._2_2_;
            (zip->entry).external_attr = stats.m_uncomp_size._4_4_;
            (zip->entry).m_time = stats._8_8_;
            zip_local._4_4_ = 0;
          }
        }
      }
    }
  }
  else {
    zip_local._4_4_ = -1;
  }
  return zip_local._4_4_;
}

Assistant:

int zip_entry_openbyindex(struct zip_t *zip, int index) {
  mz_zip_archive *pZip = NULL;
  mz_zip_archive_file_stat stats;
  mz_uint namelen;
  const mz_uint8 *pHeader;
  const char *pFilename;

  if (!zip) {
    // zip_t handler is not initialized
    return -1;
  }

  pZip = &(zip->archive);
  if (pZip->m_zip_mode != MZ_ZIP_MODE_READING) {
    // open by index requires readonly mode
    return -1;
  }

  if (index < 0 || (mz_uint)index >= pZip->m_total_files) {
    // index out of range
    return -1;
  }

  if (!(pHeader = &MZ_ZIP_ARRAY_ELEMENT(
            &pZip->m_pState->m_central_dir, mz_uint8,
            MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets,
                                 mz_uint32, index)))) {
    // cannot find header in central directory
    return -1;
  }

  namelen = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_FILENAME_LEN_OFS);
  pFilename = (const char *)pHeader + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE;

  /*
    .ZIP File Format Specification Version: 6.3.3

    4.4.17.1 The name of the file, with optional relative path.
    The path stored MUST not contain a drive or
    device letter, or a leading slash.  All slashes
    MUST be forward slashes '/' as opposed to
    backwards slashes '\' for compatibility with Amiga
    and UNIX file systems etc.  If input came from standard
    input, there is no file name field.
  */
  zip->entry.name = strrpl(pFilename, namelen, '\\', '/');
  if (!zip->entry.name) {
    // local entry name is NULL
    return -1;
  }

  if (!mz_zip_reader_file_stat(pZip, (mz_uint)index, &stats)) {
    return -1;
  }

  zip->entry.index = index;
  zip->entry.comp_size = stats.m_comp_size;
  zip->entry.uncomp_size = stats.m_uncomp_size;
  zip->entry.uncomp_crc32 = stats.m_crc32;
  zip->entry.offset = stats.m_central_dir_ofs;
  zip->entry.header_offset = stats.m_local_header_ofs;
  zip->entry.method = stats.m_method;
  zip->entry.external_attr = stats.m_external_attr;
  zip->entry.m_time = stats.m_time;

  return 0;
}